

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::AsyncIoStreamWithGuards::whenWriteDisconnected(AsyncIoStreamWithGuards *this)

{
  SourceLocation location;
  long in_RSI;
  ForkedPromise<void> local_40;
  char *pcStack_30;
  undefined8 local_28;
  anon_class_1_0_00000001_for_errorHandler local_20 [8];
  
  if (*(char *)(in_RSI + 0x49) == '\x01') {
    (**(code **)(*(long *)(*(long *)(in_RSI + 0x20) + 8) + 0x18))(this,*(long *)(in_RSI + 0x20) + 8)
    ;
  }
  else {
    ForkedPromise<void>::addBranch(&local_40);
    local_40.hub.ptr = (ForkHub<kj::_::Void> *)0x43b3c6;
    pcStack_30 = "whenWriteDisconnected";
    local_28 = 0xe00001290;
    location.function = "whenWriteDisconnected";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location.lineNumber = 0x1290;
    location.columnNumber = 0xe;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::whenWriteDisconnected()::_lambda()_1_,kj::AsyncIoStreamWithGuards::whenWriteDisconnected()::_lambda(kj::Exception&&)_1_>
              ((Promise<void> *)this,(anon_class_8_1_8991fb9c_for_func *)&local_40,local_20,location
              );
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_40);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    if (writeGuardReleased) {
      return inner->whenWriteDisconnected();
    } else {
      return writeGuard.addBranch().then([this]() {
        return inner->whenWriteDisconnected();
      }, [](kj::Exception&& e) mutable -> kj::Promise<void> {
        if (e.getType() == kj::Exception::Type::DISCONNECTED) {
          return kj::READY_NOW;
        } else {
          return kj::mv(e);
        }
      });
    }
  }